

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O3

void ScaleFilterCols_SSSE3(uint8_t *dst_ptr,uint8_t *src_ptr,int dst_width,int x,int dx)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ushort uVar11;
  ushort uVar14;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ushort uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int dst_width_local;
  
  auVar16 = ZEXT416((uint)x);
  uVar6 = (ulong)(ushort)((uint)x >> 0x10);
  iVar7 = dst_width + -2;
  if (1 < dst_width) {
    auVar13._4_4_ = x + dx;
    auVar13._0_4_ = x;
    auVar13._8_8_ = 0;
    uVar15 = (ushort)((uint)(x + dx) >> 0x10);
    iVar8 = iVar7;
    do {
      auVar16._0_4_ = auVar13._0_4_ + dx * 2;
      auVar16._4_4_ = auVar13._4_4_ + dx * 2;
      auVar16._8_4_ = auVar13._8_4_;
      auVar16._12_4_ = auVar13._12_4_;
      auVar12._0_2_ = auVar13._0_2_ >> 9;
      auVar12._2_2_ = auVar13._2_2_ >> 9;
      auVar12._4_2_ = auVar13._4_2_ >> 9;
      auVar12._6_2_ = auVar13._6_2_ >> 9;
      auVar12._8_2_ = auVar13._8_2_ >> 9;
      auVar12._10_2_ = auVar13._10_2_ >> 9;
      auVar12._12_2_ = auVar13._12_2_ >> 9;
      auVar12._14_2_ = auVar13._14_2_ >> 9;
      auVar13 = pshufb(auVar12,ZEXT416(0x4040000));
      auVar9[0] = (char)*(undefined2 *)(src_ptr + uVar6) + -0x80;
      auVar9[1] = (char)((ushort)*(undefined2 *)(src_ptr + uVar6) >> 8) + -0x80;
      auVar9[2] = (char)*(undefined2 *)(src_ptr + uVar15) + -0x80;
      auVar9[3] = (char)((ushort)*(undefined2 *)(src_ptr + uVar15) >> 8) + -0x80;
      auVar9[4] = 0x80;
      auVar9[5] = 0x80;
      auVar9[6] = 0x80;
      auVar9[7] = 0x80;
      auVar9[8] = 0x80;
      auVar9[9] = 0x80;
      auVar9[10] = 0x80;
      auVar9[0xb] = 0x80;
      auVar9[0xc] = 0x80;
      auVar9[0xd] = 0x80;
      auVar9[0xe] = 0x80;
      auVar9[0xf] = 0x80;
      auVar2[8] = 0x7f;
      auVar2._0_8_ = 0x7f007f007f007f;
      auVar2[9] = 0;
      auVar2[10] = 0x7f;
      auVar2[0xb] = 0;
      auVar2[0xc] = 0x7f;
      auVar2[0xd] = 0;
      auVar2[0xe] = 0x7f;
      auVar2[0xf] = 0;
      auVar4[8] = 1;
      auVar4._0_8_ = 0x1000100010001;
      auVar4[9] = 0;
      auVar4[10] = 1;
      auVar4[0xb] = 0;
      auVar4[0xc] = 1;
      auVar4[0xd] = 0;
      auVar4[0xe] = 1;
      auVar4[0xf] = 0;
      auVar13 = paddusb(auVar13 ^ auVar2,auVar4);
      auVar13 = pmaddubsw(auVar13,auVar9);
      uVar6 = (ulong)(ushort)((uint)auVar16._0_4_ >> 0x10);
      uVar15 = (ushort)((uint)auVar16._4_4_ >> 0x10);
      uVar11 = (ushort)(auVar13._0_2_ + 0x4040U) >> 7;
      uVar14 = (ushort)(auVar13._2_2_ + 0x4040U) >> 7;
      *(ushort *)dst_ptr =
           CONCAT11((uVar14 != 0) * (uVar14 < 0x100) * (char)uVar14 - (0xff < uVar14),
                    (uVar11 != 0) * (uVar11 < 0x100) * (char)uVar11 - (0xff < uVar11));
      dst_ptr = dst_ptr + 2;
      iVar7 = iVar8 + -2;
      bVar1 = 1 < iVar8;
      auVar13 = auVar16;
      iVar8 = iVar7;
    } while (bVar1);
  }
  if (SCARRY4(iVar7,1) == iVar7 + 1 < 0) {
    auVar17._0_2_ = auVar16._0_2_ >> 9;
    auVar17._2_2_ = auVar16._2_2_ >> 9;
    auVar17._4_2_ = auVar16._4_2_ >> 9;
    auVar17._6_2_ = auVar16._6_2_ >> 9;
    auVar17._8_2_ = auVar16._8_2_ >> 9;
    auVar17._10_2_ = auVar16._10_2_ >> 9;
    auVar17._12_2_ = auVar16._12_2_ >> 9;
    auVar17._14_2_ = auVar16._14_2_ >> 9;
    auVar16 = pshufb(auVar17,ZEXT416(0x4040000));
    auVar10[0] = (char)*(undefined2 *)(src_ptr + uVar6) + -0x80;
    auVar10[1] = (char)((ushort)*(undefined2 *)(src_ptr + uVar6) >> 8) + -0x80;
    auVar10[2] = 0x80;
    auVar10[3] = 0x80;
    auVar10[4] = 0x80;
    auVar10[5] = 0x80;
    auVar10[6] = 0x80;
    auVar10[7] = 0x80;
    auVar10[8] = 0x80;
    auVar10[9] = 0x80;
    auVar10[10] = 0x80;
    auVar10[0xb] = 0x80;
    auVar10[0xc] = 0x80;
    auVar10[0xd] = 0x80;
    auVar10[0xe] = 0x80;
    auVar10[0xf] = 0x80;
    auVar3[8] = 0x7f;
    auVar3._0_8_ = 0x7f007f007f007f;
    auVar3[9] = 0;
    auVar3[10] = 0x7f;
    auVar3[0xb] = 0;
    auVar3[0xc] = 0x7f;
    auVar3[0xd] = 0;
    auVar3[0xe] = 0x7f;
    auVar3[0xf] = 0;
    auVar5[8] = 1;
    auVar5._0_8_ = 0x1000100010001;
    auVar5[9] = 0;
    auVar5[10] = 1;
    auVar5[0xb] = 0;
    auVar5[0xc] = 1;
    auVar5[0xd] = 0;
    auVar5[0xe] = 1;
    auVar5[0xf] = 0;
    auVar16 = paddusb(auVar16 ^ auVar3,auVar5);
    auVar16 = pmaddubsw(auVar16,auVar10);
    uVar15 = (ushort)(auVar16._0_2_ + 0x4040U) >> 7;
    *dst_ptr = (uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 - (0xff < uVar15);
  }
  return;
}

Assistant:

void ScaleFilterCols_SSSE3(uint8_t* dst_ptr,
                           const uint8_t* src_ptr,
                           int dst_width,
                           int x,
                           int dx) {
  intptr_t x0, x1, temp_pixel;
  asm volatile(
      "movd        %6,%%xmm2                     \n"
      "movd        %7,%%xmm3                     \n"
      "movl        $0x04040000,%k2               \n"
      "movd        %k2,%%xmm5                    \n"
      "pcmpeqb     %%xmm6,%%xmm6                 \n"
      "psrlw       $0x9,%%xmm6                   \n"  // 0x007f007f
      "pcmpeqb     %%xmm7,%%xmm7                 \n"
      "psrlw       $15,%%xmm7                    \n"  // 0x00010001

      "pextrw      $0x1,%%xmm2,%k3               \n"
      "subl        $0x2,%5                       \n"
      "jl          29f                           \n"
      "movdqa      %%xmm2,%%xmm0                 \n"
      "paddd       %%xmm3,%%xmm0                 \n"
      "punpckldq   %%xmm0,%%xmm2                 \n"
      "punpckldq   %%xmm3,%%xmm3                 \n"
      "paddd       %%xmm3,%%xmm3                 \n"
      "pextrw      $0x3,%%xmm2,%k4               \n"

      LABELALIGN
      "2:                                        \n"
      "movdqa      %%xmm2,%%xmm1                 \n"
      "paddd       %%xmm3,%%xmm2                 \n"
      "movzwl      0x00(%1,%3,1),%k2             \n"
      "movd        %k2,%%xmm0                    \n"
      "psrlw       $0x9,%%xmm1                   \n"
      "movzwl      0x00(%1,%4,1),%k2             \n"
      "movd        %k2,%%xmm4                    \n"
      "pshufb      %%xmm5,%%xmm1                 \n"
      "punpcklwd   %%xmm4,%%xmm0                 \n"
      "psubb       %8,%%xmm0                     \n"  // make pixels signed.
      "pxor        %%xmm6,%%xmm1                 \n"  // 128 - f = (f ^ 127 ) +
                                                      // 1
      "paddusb     %%xmm7,%%xmm1                 \n"
      "pmaddubsw   %%xmm0,%%xmm1                 \n"
      "pextrw      $0x1,%%xmm2,%k3               \n"
      "pextrw      $0x3,%%xmm2,%k4               \n"
      "paddw       %9,%%xmm1                     \n"  // make pixels unsigned.
      "psrlw       $0x7,%%xmm1                   \n"
      "packuswb    %%xmm1,%%xmm1                 \n"
      "movd        %%xmm1,%k2                    \n"
      "mov         %w2,(%0)                      \n"
      "lea         0x2(%0),%0                    \n"
      "subl        $0x2,%5                       \n"
      "jge         2b                            \n"

      LABELALIGN
      "29:                                       \n"
      "addl        $0x1,%5                       \n"
      "jl          99f                           \n"
      "movzwl      0x00(%1,%3,1),%k2             \n"
      "movd        %k2,%%xmm0                    \n"
      "psrlw       $0x9,%%xmm2                   \n"
      "pshufb      %%xmm5,%%xmm2                 \n"
      "psubb       %8,%%xmm0                     \n"  // make pixels signed.
      "pxor        %%xmm6,%%xmm2                 \n"
      "paddusb     %%xmm7,%%xmm2                 \n"
      "pmaddubsw   %%xmm0,%%xmm2                 \n"
      "paddw       %9,%%xmm2                     \n"  // make pixels unsigned.
      "psrlw       $0x7,%%xmm2                   \n"
      "packuswb    %%xmm2,%%xmm2                 \n"
      "movd        %%xmm2,%k2                    \n"
      "mov         %b2,(%0)                      \n"
      "99:                                       \n"
      : "+r"(dst_ptr),      // %0
        "+r"(src_ptr),      // %1
        "=&a"(temp_pixel),  // %2
        "=&r"(x0),          // %3
        "=&r"(x1),          // %4
#if defined(__x86_64__)
        "+rm"(dst_width)  // %5
#else
        "+m"(dst_width)  // %5
#endif
      : "rm"(x),   // %6
        "rm"(dx),  // %7
#if defined(__x86_64__)
        "x"(kFsub80),  // %8
        "x"(kFadd40)   // %9
#else
        "m"(kFsub80),    // %8
        "m"(kFadd40)     // %9
#endif
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}